

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_empty_write.c
# Opt level: O2

void test_empty_write(void)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  archive *paVar4;
  archive_entry *paVar5;
  ssize_t sVar6;
  char *pcVar7;
  longlong lVar8;
  size_t used;
  char buff [32768];
  
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L')',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'*',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",paVar4);
  wVar2 = archive_write_add_filter_gzip(paVar4);
  if (wVar2 == L'\0') {
LAB_0013c057:
    pcVar7 = "ARCHIVE_OK";
    wVar3 = L'2';
    lVar8 = 0;
LAB_0013c078:
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                        ,wVar3,lVar8,pcVar7,(long)wVar2,"r",paVar4);
    iVar1 = archive_write_open_memory(paVar4,buff,0x8000,&used);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                        ,L'4',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar4);
    paVar5 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                     ,L'6',(uint)(paVar5 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar5,"file");
    archive_entry_set_mode(paVar5,0x81ed);
    archive_entry_set_size(paVar5,0);
    iVar1 = archive_write_header(paVar4,paVar5);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                     ,L':',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar4);
    archive_entry_free(paVar5);
    sVar6 = archive_write_data(paVar4,"",0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                        ,L'?',0,"0",sVar6,"archive_write_data(a, \"\", 0)",paVar4);
    iVar1 = archive_write_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                        ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
    iVar1 = archive_write_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                        ,L'C',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  }
  else {
    wVar3 = canGzip();
    if (wVar3 != L'\0') {
      wVar3 = canGzip();
      if (wVar3 == L'\0') goto LAB_0013c057;
      pcVar7 = "ARCHIVE_WARN";
      wVar3 = L'0';
      lVar8 = -0x14;
      goto LAB_0013c078;
    }
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'-');
    test_skipping("Empty write to gzip-compressed archive");
  }
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'K',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'L',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",paVar4);
  wVar2 = archive_write_add_filter_bzip2(paVar4);
  if (wVar2 == L'\0') {
LAB_0013c271:
    pcVar7 = "ARCHIVE_OK";
    wVar3 = L'T';
    lVar8 = 0;
  }
  else {
    wVar3 = canBzip2();
    if (wVar3 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                     ,L'O');
      test_skipping("Empty write to bzip2-compressed archive");
      goto LAB_0013c3f3;
    }
    wVar3 = canBzip2();
    if (wVar3 == L'\0') goto LAB_0013c271;
    pcVar7 = "ARCHIVE_WARN";
    wVar3 = L'R';
    lVar8 = -0x14;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                      ,wVar3,lVar8,pcVar7,(long)wVar2,"r",paVar4);
  iVar1 = archive_write_open_memory(paVar4,buff,0x8000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                      ,L'V',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar4);
  paVar5 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'X',(uint)(paVar5 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar5,"file");
  archive_entry_set_mode(paVar5,0x81ed);
  archive_entry_set_size(paVar5,0);
  iVar1 = archive_write_header(paVar4,paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'\\',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  sVar6 = archive_write_data(paVar4,"",0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                      ,L'`',0,"0",sVar6,"archive_write_data(a, \"\", 0)",paVar4);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                      ,L'c',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                      ,L'd',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
LAB_0013c3f3:
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'l',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'm',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",paVar4);
  iVar1 = archive_write_add_filter_none(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'n',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar4);
  iVar1 = archive_write_open_memory(paVar4,buff,0x8000,&used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'o',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar4);
  paVar5 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'q',(uint)(paVar5 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar5,"file");
  archive_entry_set_mode(paVar5,0x81ed);
  archive_entry_set_size(paVar5,0);
  iVar1 = archive_write_header(paVar4,paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                   ,L'u',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  sVar6 = archive_write_data(paVar4,"",0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                      ,L'y',0,"0",sVar6,"archive_write_data(a, \"\", 0)",paVar4);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_empty_write.c"
                      ,L'}',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_empty_write)
{
	char buff[32768];
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	int r;

	/*
	 * Exercise a zero-byte write to a gzip-compressed archive.
	 */

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	r = archive_write_add_filter_gzip(a);
	if (r != ARCHIVE_OK && !canGzip()) {
		skipping("Empty write to gzip-compressed archive");
	} else {
		if (r != ARCHIVE_OK && canGzip())
			assertEqualIntA(a, ARCHIVE_WARN, r);
		else
			assertEqualIntA(a, ARCHIVE_OK, r);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, sizeof(buff), &used));
		/* Write a file to it. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, "file");
		archive_entry_set_mode(ae, S_IFREG | 0755);
		archive_entry_set_size(ae, 0);
		assertA(0 == archive_write_header(a, ae));
		archive_entry_free(ae);

		/* THE TEST: write zero bytes to this entry. */
		/* This used to crash. */
		assertEqualIntA(a, 0, archive_write_data(a, "", 0));

		/* Close out the archive. */
		assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	}

	/*
	 * Again, with bzip2 compression.
	 */

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	r = archive_write_add_filter_bzip2(a);
	if (r != ARCHIVE_OK && !canBzip2()) {
		skipping("Empty write to bzip2-compressed archive");
	} else {
		if (r != ARCHIVE_OK && canBzip2())
			assertEqualIntA(a, ARCHIVE_WARN, r);
		else
			assertEqualIntA(a, ARCHIVE_OK, r);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, sizeof(buff), &used));
		/* Write a file to it. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, "file");
		archive_entry_set_mode(ae, S_IFREG | 0755);
		archive_entry_set_size(ae, 0);
		assertA(0 == archive_write_header(a, ae));
		archive_entry_free(ae);

		/* THE TEST: write zero bytes to this entry. */
		assertEqualIntA(a, 0, archive_write_data(a, "", 0));

		/* Close out the archive. */
		assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	}

	/*
	 * For good measure, one more time with no compression.
	 */

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));
	/* Write a file to it. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 0);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);

	/* THE TEST: write zero bytes to this entry. */
	assertEqualIntA(a, 0, archive_write_data(a, "", 0));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
}